

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void Luv24toXYZ(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  ulong uVar1;
  float *xyz;
  uint32_t *puVar2;
  
  if (0 < n) {
    puVar2 = (uint32_t *)sp->tbuf;
    uVar1 = n + 1;
    do {
      LogLuv24toXYZ(*puVar2,(float *)op);
      op = (uint8_t *)((long)op + 0xc);
      puVar2 = puVar2 + 1;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

static void Luv24toXYZ(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    float *xyz = (float *)op;

    while (n-- > 0)
    {
        LogLuv24toXYZ(*luv, xyz);
        xyz += 3;
        luv++;
    }
}